

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void __thiscall EDCircles::ValidateCircles(EDCircles *this)

{
  uint uVar1;
  EllipseEquation *eq_00;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  Circle *pCVar6;
  uchar *puVar7;
  bool bVar8;
  uint uVar9;
  double *px;
  double *py;
  NFALUT *pNVar10;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  uint uVar31;
  double dVar30;
  undefined1 auVar32 [16];
  double dVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  EllipseEquation eq;
  EllipseEquation local_68;
  
  iVar18 = (this->super_EDPF).super_ED.width;
  iVar14 = (this->super_EDPF).super_ED.height;
  iVar15 = iVar14 + iVar18;
  iVar13 = iVar15 * 8;
  uVar25 = 0xffffffffffffffff;
  if (-1 < iVar15) {
    uVar25 = (long)iVar13 << 3;
  }
  px = (double *)operator_new__(uVar25);
  py = (double *)operator_new__(uVar25);
  dVar27 = log10((double)(iVar14 * iVar18));
  dVar28 = log10((double)((this->super_EDPF).super_ED.height + (this->super_EDPF).super_ED.width));
  iVar15 = (this->super_EDPF).super_ED.width;
  iVar18 = (this->super_EDPF).super_ED.height;
  iVar14 = iVar18 + iVar15;
  iVar15 = iVar18 + iVar15 + 7;
  if (-1 < iVar14) {
    iVar15 = iVar14;
  }
  pNVar10 = (NFALUT *)operator_new(0x20);
  NFALUT::NFALUT(pNVar10,iVar15 >> 3,0.125,dVar27 + dVar27 + dVar28);
  this->nfa = pNVar10;
  if (this->noCircles1 < 1) {
    iVar15 = 0;
  }
  else {
    iVar15 = 0;
    iVar18 = 0;
    do {
      pCVar6 = this->circles1;
      dVar27 = pCVar6[iVar18].r;
      iVar14 = (this->super_EDPF).super_ED.width;
      iVar26 = (this->super_EDPF).super_ED.height;
      if (iVar26 < iVar14) {
        iVar26 = iVar14;
      }
      if ((double)iVar26 < dVar27) {
LAB_0010ecd4:
        iVar18 = iVar18 + 1;
      }
      else {
        dVar28 = pCVar6[iVar18].xc;
        dVar2 = pCVar6[iVar18].yc;
        eq_00 = &pCVar6[iVar18].eq;
        dVar29 = computeEllipsePerimeter(eq_00);
        if ((int)dVar29 <= iVar13) {
          if (pCVar6[iVar18].isEllipse == true) {
            uVar23 = (int)dVar29 & 0xfffffffe;
            uVar25 = (ulong)uVar23;
            ComputeEllipsePoints(eq_00->coeff,px,py,uVar23);
            uVar11 = extraout_RAX;
          }
          else {
            dVar29 = 0.0;
            uVar25 = 0;
            do {
              dVar33 = cos(dVar29);
              dVar30 = sin(dVar29);
              dVar29 = dVar29 + 6.283185307179586 / (double)(int)(dVar27 * 6.283185307179586 + 0.5);
              px[uVar25] = (double)(int)(dVar33 * dVar27 + dVar28 + 0.5);
              py[uVar25] = (double)(int)(dVar30 * dVar27 + dVar2 + 0.5);
              uVar25 = uVar25 + 1;
              uVar11 = extraout_RAX_00;
            } while (dVar29 < 6.283185307179586);
          }
          if ((int)uVar25 < 1) {
            iVar14 = 0;
            iVar26 = 0;
          }
          else {
            uVar23 = 0xffffffff;
            uVar31 = 0xffffffff;
            uVar20 = 0;
            iVar26 = 0;
            iVar14 = 0;
            do {
              uVar35 = (uint)(px[uVar20] + 0.5);
              uVar36 = (uint)(py[uVar20] + 0.5);
              auVar32._0_4_ = -(uint)(uVar23 == uVar35);
              auVar32._4_4_ = auVar32._0_4_;
              auVar32._8_4_ = -(uint)(uVar31 == uVar36);
              auVar32._12_4_ = -(uint)(uVar31 == uVar36);
              uVar9 = movmskpd((int)uVar11,auVar32);
              uVar11 = (ulong)uVar9;
              if ((uVar9 != 3) && (iVar26 = iVar26 + 1, 0 < (int)uVar36)) {
                iVar5 = (this->super_EDPF).super_ED.height;
                uVar1 = iVar5 - 1;
                uVar11 = (ulong)CONCAT31((int3)(uVar9 >> 8),(int)uVar1 <= (int)uVar36);
                if (0 < (int)uVar35 && (int)uVar1 > (int)uVar36) {
                  uVar9 = (this->super_EDPF).super_ED.width;
                  uVar11 = (ulong)uVar9;
                  if ((int)uVar35 < (int)(uVar9 - 1)) {
                    puVar7 = (this->super_EDPF).super_ED.edgeImg;
                    iVar22 = uVar9 * uVar36;
                    lVar17 = (long)(int)(iVar22 + uVar35);
                    uVar24 = uVar36;
                    uVar19 = uVar35;
                    uVar23 = uVar35;
                    uVar31 = uVar36;
                    if (puVar7[lVar17] == 0xff) goto LAB_0010f03a;
                    iVar16 = (int)((((double)(int)uVar36 - dVar2) + (double)(int)uVar35) - dVar28);
                    if ((int)((((double)(int)uVar36 - dVar2) - (double)(int)uVar35) + dVar28) < 0) {
                      if (iVar16 < 1) goto LAB_0010ef3a;
LAB_0010efd0:
                      if ((uVar35 == 1) ||
                         (lVar17 = (long)(int)(iVar22 + uVar35 + -1), puVar7[lVar17] != 0xff)) {
                        uVar19 = uVar35 + 1;
                        if ((uVar9 - 1 <= uVar19) ||
                           (lVar17 = (long)(int)(iVar22 + uVar19), puVar7[lVar17] != 0xff)) {
                          if ((uVar35 < 4) ||
                             (lVar17 = (long)(int)(iVar22 + uVar35 + -2), puVar7[lVar17] != 0xff)) {
                            uVar19 = uVar35 + 2;
                            if (uVar19 < uVar9 - 2) {
                              iVar22 = iVar22 + uVar19;
                              goto LAB_0010f01a;
                            }
                            goto LAB_0010efb3;
                          }
                          uVar19 = uVar35 - 2;
                        }
                      }
                      else {
                        uVar19 = uVar35 - 1;
                      }
                    }
                    else {
                      if (iVar16 < 1) goto LAB_0010efd0;
LAB_0010ef3a:
                      if (uVar36 != 1) {
                        lVar17 = (long)(int)(uVar9 * (uVar36 - 1) + uVar35);
                        uVar24 = uVar36 - 1;
                        if (puVar7[lVar17] == 0xff) goto LAB_0010f03a;
                      }
                      uVar24 = uVar36 + 1;
                      if ((uVar1 <= uVar24) ||
                         (lVar17 = (long)(int)(uVar9 * uVar24 + uVar35), puVar7[lVar17] != 0xff)) {
                        if (3 < uVar36) {
                          lVar17 = (long)(int)(uVar9 * (uVar36 - 2) + uVar35);
                          uVar24 = uVar36 - 2;
                          if (puVar7[lVar17] == 0xff) goto LAB_0010f03a;
                        }
                        uVar24 = uVar36 + 2;
                        if (iVar5 - 2U <= uVar24) goto LAB_0010efb3;
                        iVar22 = uVar9 * uVar24 + uVar35;
LAB_0010f01a:
                        lVar17 = (long)iVar22;
                        if (puVar7[lVar17] != 0xff) goto LAB_0010efb3;
                      }
                    }
LAB_0010f03a:
                    puVar7 = (this->super_EDPF).super_ED.smoothImg;
                    lVar21 = (long)(int)((uVar24 + 1) * uVar9 + uVar19);
                    lVar12 = (long)(int)((uVar24 - 1) * uVar9 + uVar19);
                    dVar27 = NFALUT::myAtan2((double)(int)(((uint)puVar7[lVar17 + 1] +
                                                            ((uint)puVar7[lVar12 + 1] -
                                                            (uint)puVar7[lVar21 + -1]) +
                                                           ((uint)puVar7[lVar21 + 1] -
                                                           (uint)puVar7[lVar12 + -1])) -
                                                          (uint)puVar7[lVar17 + -1]),
                                             (double)(int)((((uint)puVar7[lVar12 + 1] -
                                                            (uint)puVar7[lVar21 + -1]) -
                                                           ((uint)puVar7[lVar21] +
                                                           ((uint)puVar7[lVar21 + 1] -
                                                           (uint)puVar7[lVar12 + -1]))) +
                                                          (uint)puVar7[lVar12]));
                    dVar33 = (double)(int)uVar19;
                    dVar29 = (double)(int)uVar24;
                    if (pCVar6[iVar18].isEllipse == true) {
                      dVar30 = pCVar6[iVar18].eq.coeff[1];
                      dVar3 = pCVar6[iVar18].eq.coeff[2];
                      dVar30 = (dVar30 + dVar30) * dVar33 + dVar3 * dVar29 +
                               pCVar6[iVar18].eq.coeff[4];
                      dVar4 = pCVar6[iVar18].eq.coeff[3];
                      dVar29 = dVar3 * dVar33 + (dVar4 + dVar4) * dVar29 +
                               pCVar6[iVar18].eq.coeff[5];
                    }
                    else {
                      dVar30 = dVar33 - dVar28;
                      dVar29 = dVar29 - dVar2;
                    }
                    dVar29 = NFALUT::myAtan2(dVar30,-dVar29);
                    uVar34 = -(ulong)(ABS(dVar27 - dVar29) <= 0.19634954084936207 ||
                                     2.945243112740431 <= ABS(dVar27 - dVar29));
                    uVar11 = uVar34 & 0xffffffff;
                    iVar14 = iVar14 - (int)uVar34;
                  }
                }
              }
LAB_0010efb3:
              uVar20 = uVar20 + 1;
            } while ((uVar25 & 0xffffffff) != uVar20);
          }
          if (pCVar6[iVar18].isEllipse != false) {
            computeEllipsePerimeter(eq_00);
          }
          bVar8 = NFALUT::checkValidationByNFA(this->nfa,iVar26,iVar14);
          if (bVar8) {
            lVar17 = (long)iVar15;
            iVar15 = iVar15 + 1;
            memcpy(this->circles2 + lVar17,this->circles1 + iVar18,0x98);
          }
          else if ((pCVar6[iVar18].isEllipse == false) && (0.5 <= pCVar6[iVar18].coverRatio)) {
            local_68.coeff[4] = 0.0;
            local_68.coeff[5] = 0.0;
            local_68.coeff[2] = 0.0;
            local_68.coeff[3] = 0.0;
            local_68.coeff[0] = 0.0;
            local_68.coeff[1] = 0.0;
            local_68.coeff[6] = 0.0;
            bVar8 = EllipseFit(pCVar6[iVar18].x,pCVar6[iVar18].y,pCVar6[iVar18].noPixels,&local_68,1
                              );
            if ((!bVar8) ||
               (dVar27 = ComputeEllipseError(&local_68,pCVar6[iVar18].x,pCVar6[iVar18].y,
                                             pCVar6[iVar18].noPixels), 1.5 < dVar27))
            goto LAB_0010ed15;
            pCVar6[iVar18].isEllipse = true;
            pCVar6[iVar18].ellipseFitError = dVar27;
            pCVar6[iVar18].eq.coeff[6] = local_68.coeff[6];
            pCVar6[iVar18].eq.coeff[4] = local_68.coeff[4];
            pCVar6[iVar18].eq.coeff[5] = local_68.coeff[5];
            pCVar6[iVar18].eq.coeff[2] = local_68.coeff[2];
            pCVar6[iVar18].eq.coeff[3] = local_68.coeff[3];
            eq_00->coeff[0] = local_68.coeff[0];
            pCVar6[iVar18].eq.coeff[1] = local_68.coeff[1];
            goto LAB_0010ed1c;
          }
          goto LAB_0010ecd4;
        }
LAB_0010ed15:
        iVar18 = iVar18 + 1;
      }
LAB_0010ed1c:
    } while (iVar18 < this->noCircles1);
  }
  this->noCircles2 = iVar15;
  operator_delete__(px);
  operator_delete__(py);
  pNVar10 = this->nfa;
  if (pNVar10 != (NFALUT *)0x0) {
    NFALUT::~NFALUT(pNVar10);
  }
  operator_delete(pNVar10);
  return;
}

Assistant:

void EDCircles::ValidateCircles()
{
	double prec = PI / 16;  // Alignment precision
	double prob = 1.0 / 8;  // probability of alignment

	int points_buffer_size = 8 * (width + height);
	double *px = new double[points_buffer_size];
	double *py = new double[points_buffer_size];

	// logNT & LUT for NFA computation
	double logNT = 2 * log10((double)(width*height)) + log10((double)(width + height));

	int lutSize = (width + height) / 8;
	nfa = new NFALUT(lutSize, prob, logNT); // create look up table

	// Validate circles & ellipses
	bool validateAgain;
	int count = 0;
	for (int i = 0; i<noCircles1; ) {
		Circle *circle = &circles1[i];
		double xc = circle->xc;
		double yc = circle->yc;
		double radius = circle->r;

		// Skip potential invalid circles (sometimes these kinds of candidates get generated!)
		if (radius > MAX(width, height)) { i++; continue; }

		validateAgain = false;

		int noPoints = (int)(computeEllipsePerimeter(&circle->eq));

		if (noPoints > points_buffer_size)
		{
			i++;
			continue;
		}

		if (circle->isEllipse) {
			if (noPoints % 2) noPoints--;
			ComputeEllipsePoints(circle->eq.coeff, px, py, noPoints);

		}
		else {
			ComputeCirclePoints(xc, yc, radius, px, py, &noPoints);
		} //end-else

		int pr = -1;  // previous row
		int pc = -1;  // previous column

		int tr = -100;
		int tc = -100;
		int tcount = 0;

		int noPeripheryPixels = 0;
		int noEdgePixels = 0;
		int aligned = 0;
		for (int j = 0; j<noPoints; j++) {
			int r = (int)(py[j] + 0.5);
			int c = (int)(px[j] + 0.5);

			if (r == pr && c == pc) continue;
			noPeripheryPixels++;

			if (r <= 0 || r >= height - 1) continue;
			if (c <= 0 || c >= width - 1) continue;

			pr = r;
			pc = c;

			int dr = abs(r - tr);
			int dc = abs(c - tc);
			if (dr + dc >= 2) {
				tr = r;
				tc = c;
				tcount++;
			} //end-if

#if 1
			  //
			  // See if there is an edge pixel within 1 pixel vicinity
			  //
			if (edgeImg[r*width + c] != 255) {
				//   y-cy=-x-cx    y-cy=x-cx
				//         \       /
				//          \ IV. /
				//           \   / 
				//            \ / 
				//     III.    +   I. quadrant
				//            / \
				//           /   \ 
				//          / II. \
				//         /       \
				//
				// (x, y)-->(x-cx, y-cy)
				//
				
				int x = c;
				int y = r;

				int diff1 = (int)(y - yc - x + xc);
				int diff2 = (int)(y - yc + x - xc);

				if (diff1 < 0) {
					if (diff2 > 0) {
						// I. quadrant
						c = x - 1;
						if (c >= 1 && edgeImg[r*width + c] == 255) goto out;
						c = x + 1;
						if (c<width - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						c = x - 2;
						if (c >= 2 && edgeImg[r*width + c] == 255) goto out;
						c = x + 2;
						if (c<width - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					}
					else {
						// IV. quadrant
						r = y - 1;
						if (r >= 1 && edgeImg[r*width + c] == 255) goto out;
						r = y + 1;
						if (r<height - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						r = y - 2;
						if (r >= 2 && edgeImg[r*width + c] == 255) goto out;
						r = y + 2;
						if (r<height - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					} //end-else

				}
				else {
					if (diff2 > 0) {
						// II. quadrant
						r = y - 1;
						if (r >= 1 && edgeImg[r*width + c] == 255) goto out;
						r = y + 1;
						if (r<height - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						r = y - 2;
						if (r >= 2 && edgeImg[r*width + c] == 255) goto out;
						r = y + 2;
						if (r<height - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					}
					else {
						// III. quadrant
						c = x - 1;
						if (c >= 1 && edgeImg[r*width + c] == 255) goto out;
						c = x + 1;
						if (c<width - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						c = x - 2;
						if (c >= 2 && edgeImg[r*width + c] == 255) goto out;
						c = x + 2;
						if (c<width - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					} //end-else
				} //end-else

				r = pr;
				c = pc;
				continue;  // Ignore non-edge pixels. 
						   // This produces less false positives, but occationally misses on some valid circles
			} //end-if
		out:
			if (edgeImg[r*width + c] == 255) noEdgePixels++;
			//      map->edgeImg[r*width+c] = 254;
#endif

			// compute gx & gy
			int com1 = smoothImg[(r + 1)*width + c + 1] - smoothImg[(r - 1)*width + c - 1];
			int com2 = smoothImg[(r - 1)*width + c + 1] - smoothImg[(r + 1)*width + c - 1];

			int gx = com1 + com2 + smoothImg[r*width + c + 1] - smoothImg[r*width + c - 1];
			int gy = com1 - com2 + smoothImg[(r + 1)*width + c] - smoothImg[(r - 1)*width + c];
			double pixelAngle = nfa->myAtan2((double)gx, (double)-gy);

			double derivX, derivY;
			if (circle->isEllipse) {
				// Ellipse
				derivX = 2 * circle->eq.A()*c + circle->eq.B()*r + circle->eq.D();
				derivY = circle->eq.B()*c + 2 * circle->eq.C()*r + circle->eq.E();

			}
			else {
				// circle
				derivX = c - xc;
				derivY = r - yc;
			} //end-else

			double idealPixelAngle = nfa->myAtan2(derivX, -derivY);
			double diff = fabs(pixelAngle - idealPixelAngle);
			if (diff <= prec || diff >= PI - prec) aligned++;
		} //end-for

		double circumference;
		if (circle->isEllipse) circumference = computeEllipsePerimeter(&circle->eq);
		else                   circumference = TWOPI*radius;

		// Validate by NFA
		bool isValid = nfa->checkValidationByNFA(noPeripheryPixels, aligned);

		if (isValid) {
			circles2[count++] = circles1[i];

		}
		else if (circle->isEllipse == false && circle->coverRatio >= CANDIDATE_ELLIPSE_RATIO) {
			// Fit an ellipse to this circle, and try to revalidate
			double ellipseFitError = 1e10;
			EllipseEquation eq;

			if (EllipseFit(circle->x, circle->y, circle->noPixels, &eq)) {
				ellipseFitError = ComputeEllipseError(&eq, circle->x, circle->y, circle->noPixels);
			} //end-if

			if (ellipseFitError <= ELLIPSE_ERROR) {
				circle->isEllipse = true;
				circle->ellipseFitError = ellipseFitError;
				circle->eq = eq;

				validateAgain = true;
			} //end-if
		} //end-else

		if (validateAgain == false) i++;
	} //end-for

	noCircles2 = count;

	delete[] px;
	delete[] py;
	delete nfa;
}